

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O2

UChar32 ucnv_MBCSSimpleGetNextUChar_63
                  (UConverterSharedData *sharedData,char *source,int32_t length,UBool useFallback)

{
  ushort uVar1;
  uint16_t *puVar2;
  int32_t *cx;
  UChar32 UVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  if (0 < length) {
    puVar2 = (sharedData->mbcs).unicodeCodeUnits;
    uVar7 = (uint)(sharedData->mbcs).dbcsOnlyState;
    uVar6 = 0;
    iVar4 = 0;
    do {
      uVar5 = *(uint *)((long)*(sharedData->mbcs).stateTable +
                       (ulong)(byte)source[uVar6] * 4 + (ulong)(uVar7 << 10));
      if ((int)uVar5 < 0) {
        uVar7 = 0xfffe;
        switch(uVar5 >> 0x14 & 0xf) {
        case 0:
        case 2:
          uVar7 = uVar5 & 0xffff;
          break;
        case 1:
        case 3:
          uVar7 = (uVar5 & 0xfffff) + 0x10000;
          break;
        case 4:
          uVar5 = (uVar5 & 0xffff) + iVar4;
          uVar7 = (uint)puVar2[uVar5];
          if (uVar7 == 0xfffe) {
            uVar7 = ucnv_MBCSGetFallback(&sharedData->mbcs,uVar5);
          }
          break;
        case 5:
          uVar1 = puVar2[(uVar5 & 0xffff) + iVar4];
          uVar7 = (uint)uVar1;
          if (0xd7ff < uVar1) {
            uVar5 = iVar4 + (uVar5 & 0xffff) + 1;
            if (uVar1 < 0xe000) {
              uVar7 = (uint)puVar2[uVar5] + (uVar7 & 0x3ff) * 0x400 + 0x2400;
            }
            else if ((uVar1 & 0xfffe) == 0xe000) {
              uVar7 = (uint)puVar2[uVar5];
            }
            else {
              bVar8 = uVar7 == 0xffff;
              uVar7 = 0xfffe;
              if (bVar8) {
                return 0xffff;
              }
            }
          }
          break;
        case 6:
          break;
        default:
          return 0xffff;
        }
        if (length + -1 != (int)uVar6) {
          return 0xffff;
        }
        if (uVar7 != 0xfffe) {
          return uVar7;
        }
        cx = (sharedData->mbcs).extIndexes;
        if (cx == (int32_t *)0x0) {
          return 0xfffe;
        }
        UVar3 = ucnv_extSimpleMatchToU_63(cx,source,length,useFallback);
        return UVar3;
      }
      uVar6 = uVar6 + 1;
      uVar7 = uVar5 >> 0x18;
      iVar4 = iVar4 + (uVar5 & 0xffffff);
    } while ((uint)length != uVar6);
  }
  return 0xffff;
}

Assistant:

U_CFUNC UChar32
ucnv_MBCSSimpleGetNextUChar(UConverterSharedData *sharedData,
                        const char *source, int32_t length,
                        UBool useFallback) {
    const int32_t (*stateTable)[256];
    const uint16_t *unicodeCodeUnits;

    uint32_t offset;
    uint8_t state, action;

    UChar32 c;
    int32_t i, entry;

    if(length<=0) {
        /* no input at all: "illegal" */
        return 0xffff;
    }

#if 0
/*
 * Code disabled 2002dec09 (ICU 2.4) because it is not currently used in ICU. markus
 * TODO In future releases, verify that this function is never called for SBCS
 * conversions, i.e., that sharedData->mbcs.countStates==1 is still true.
 * Removal improves code coverage.
 */
    /* use optimized function if possible */
    if(sharedData->mbcs.countStates==1) {
        if(length==1) {
            return ucnv_MBCSSingleSimpleGetNextUChar(sharedData, (uint8_t)*source, useFallback);
        } else {
            return 0xffff; /* illegal: more than a single byte for an SBCS converter */
        }
    }
#endif

    /* set up the local pointers */
    stateTable=sharedData->mbcs.stateTable;
    unicodeCodeUnits=sharedData->mbcs.unicodeCodeUnits;

    /* converter state */
    offset=0;
    state=sharedData->mbcs.dbcsOnlyState;

    /* conversion loop */
    for(i=0;;) {
        entry=stateTable[state][(uint8_t)source[i++]];
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);

            if(i==length) {
                return 0xffff; /* truncated character */
            }
        } else {
            /*
             * An if-else-if chain provides more reliable performance for
             * the most common cases compared to a switch.
             */
            action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
            if(action==MBCS_STATE_VALID_16) {
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[offset];
                if(c!=0xfffe) {
                    /* done */
                } else if(UCNV_TO_U_USE_FALLBACK(cnv)) {
                    c=ucnv_MBCSGetFallback(&sharedData->mbcs, offset);
                /* else done with 0xfffe */
                }
                break;
            } else if(action==MBCS_STATE_VALID_DIRECT_16) {
                /* output BMP code point */
                c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                break;
            } else if(action==MBCS_STATE_VALID_16_PAIR) {
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[offset++];
                if(c<0xd800) {
                    /* output BMP code point below 0xd800 */
                } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? c<=0xdfff : c<=0xdbff) {
                    /* output roundtrip or fallback supplementary code point */
                    c=(UChar32)(((c&0x3ff)<<10)+unicodeCodeUnits[offset]+(0x10000-0xdc00));
                } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? (c&0xfffe)==0xe000 : c==0xe000) {
                    /* output roundtrip BMP code point above 0xd800 or fallback BMP code point */
                    c=unicodeCodeUnits[offset];
                } else if(c==0xffff) {
                    return 0xffff;
                } else {
                    c=0xfffe;
                }
                break;
            } else if(action==MBCS_STATE_VALID_DIRECT_20) {
                /* output supplementary code point */
                c=0x10000+MBCS_ENTRY_FINAL_VALUE(entry);
                break;
            } else if(action==MBCS_STATE_FALLBACK_DIRECT_16) {
                if(!TO_U_USE_FALLBACK(useFallback)) {
                    c=0xfffe;
                    break;
                }
                /* output BMP code point */
                c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                break;
            } else if(action==MBCS_STATE_FALLBACK_DIRECT_20) {
                if(!TO_U_USE_FALLBACK(useFallback)) {
                    c=0xfffe;
                    break;
                }
                /* output supplementary code point */
                c=0x10000+MBCS_ENTRY_FINAL_VALUE(entry);
                break;
            } else if(action==MBCS_STATE_UNASSIGNED) {
                c=0xfffe;
                break;
            }

            /*
             * forbid MBCS_STATE_CHANGE_ONLY for this function,
             * and MBCS_STATE_ILLEGAL and reserved action codes
             */
            return 0xffff;
        }
    }

    if(i!=length) {
        /* illegal for this function: not all input consumed */
        return 0xffff;
    }

    if(c==0xfffe) {
        /* try an extension mapping */
        const int32_t *cx=sharedData->mbcs.extIndexes;
        if(cx!=NULL) {
            return ucnv_extSimpleMatchToU(cx, source, length, useFallback);
        }
    }

    return c;
}